

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  bool bVar1;
  TestCase *pTVar2;
  reference ppTVar3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar4;
  TestInfo *pTVar5;
  const_reference ppTVar6;
  char *pcVar7;
  FILE *__stream;
  undefined8 uVar8;
  long in_FS_OFFSET;
  ostream *local_370;
  ostream *local_360;
  FILE *fileout;
  string *output_format;
  TestInfo *test_info;
  size_t j;
  bool printed_test_case_name;
  TestCase *test_case;
  size_t i;
  int kMaxParamLength;
  UnitTestImpl *this_local;
  string local_2a8;
  string local_288 [32];
  JsonUnitTestResultPrinter local_268;
  string local_240 [32];
  XmlUnitTestResultPrinter local_220;
  stringstream local_1f8 [8];
  stringstream stream;
  ostream aoStack_1e8 [376];
  string local_70 [32];
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  for (test_case = (TestCase *)0x0;
      pTVar2 = (TestCase *)
               std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                         (&this->test_cases_), test_case < pTVar2;
      test_case = (TestCase *)((long)&test_case->_vptr_TestCase + 1)) {
    ppTVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,(size_type)test_case);
    pTVar2 = *ppTVar3;
    bVar1 = false;
    test_info = (TestInfo *)0x0;
    while( true ) {
      pvVar4 = TestCase::test_info_list(pTVar2);
      pTVar5 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar4);
      if (pTVar5 <= test_info) break;
      pvVar4 = TestCase::test_info_list(pTVar2);
      ppTVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar4,(size_type)test_info);
      pTVar5 = *ppTVar6;
      if ((pTVar5->matches_filter_ & 1U) != 0) {
        if (!bVar1) {
          bVar1 = true;
          pcVar7 = TestCase::name(pTVar2);
          printf("%s.",pcVar7);
          pcVar7 = TestCase::type_param(pTVar2);
          if (pcVar7 != (char *)0x0) {
            printf("  # %s = ","TypeParam");
            pcVar7 = TestCase::type_param(pTVar2);
            PrintOnOneLine(pcVar7,0xfa);
          }
          printf("\n");
        }
        pcVar7 = TestInfo::name(pTVar5);
        printf("  %s",pcVar7);
        pcVar7 = TestInfo::value_param(pTVar5);
        if (pcVar7 != (char *)0x0) {
          printf("  # %s = ","GetParam()");
          pcVar7 = TestInfo::value_param(pTVar5);
          PrintOnOneLine(pcVar7,0xfa);
        }
        printf("\n");
      }
      test_info = (TestInfo *)&(test_info->test_case_name_).field_0x1;
    }
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  bVar1 = std::operator==(&local_30,"xml");
  if ((bVar1) || (bVar1 = std::operator==(&local_30,"json"), bVar1)) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,pcVar7,(allocator<char> *)((long)&this_local + 7));
    __stream = (FILE *)OpenFileForWriting(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)((long)&this_local + 7));
    std::__cxx11::string::~string(local_70);
    std::__cxx11::stringstream::stringstream(local_1f8);
    bVar1 = std::operator==(&local_30,"xml");
    if (bVar1) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(&local_220,pcVar7);
      local_360 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1f8) {
        local_360 = aoStack_1e8;
      }
      XmlUnitTestResultPrinter::PrintXmlTestsList(local_360,&this->test_cases_);
      XmlUnitTestResultPrinter::~XmlUnitTestResultPrinter(&local_220);
      std::__cxx11::string::~string(local_240);
    }
    else {
      bVar1 = std::operator==(&local_30,"json");
      if (bVar1) {
        UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(&local_268,pcVar7);
        local_370 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x1f8) {
          local_370 = aoStack_1e8;
        }
        JsonUnitTestResultPrinter::PrintJsonTestList(local_370,&this->test_cases_);
        JsonUnitTestResultPrinter::~JsonUnitTestResultPrinter(&local_268);
        std::__cxx11::string::~string(local_288);
      }
    }
    StringStreamToString(&local_2a8,(stringstream *)local_1f8);
    uVar8 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s",uVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    fclose(__stream);
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (size_t i = 0; i < test_cases_.size(); i++) {
    const TestCase* const test_case = test_cases_[i];
    bool printed_test_case_name = false;

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      const TestInfo* const test_info =
          test_case->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_case_name) {
          printed_test_case_name = true;
          printf("%s.", test_case->name());
          if (test_case->type_param() != NULL) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_case->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != NULL) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout = OpenFileForWriting(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_cases_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_cases_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
}